

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O3

bool __thiscall Parameter<int>::setData(Parameter<int> *this,int ival)

{
  (this->super_ParameterBase).empty_ = false;
  *(int *)&(this->super_ParameterBase).field_0x2c = ival;
  return true;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }